

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O3

void sptk::world::anon_unknown_5::HarvestGeneralBody
               (double *x,int x_length,int fs,int frame_period,double f0_floor,double f0_ceil,
               double channels_in_octave,int speed,double allowed_range,double *temporal_positions,
               double *f0)

{
  double dVar1;
  double **f0_candidates;
  undefined8 uVar2;
  bool bVar3;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  fft_plan p_04;
  fft_plan p_05;
  fft_plan p_06;
  undefined8 uVar4;
  undefined8 uVar5;
  double *pdVar6;
  int i_2;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint x_length_00;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  double *in;
  fft_complex *out;
  ulong uVar15;
  long *plVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  double *pdVar20;
  double *pdVar21;
  fft_complex *out_00;
  fft_complex *padVar22;
  double *pdVar23;
  void *pvVar24;
  double *intervals;
  double *intervals_00;
  double *intervals_01;
  double *intervals_02;
  undefined4 *puVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  double *pdVar30;
  int *piVar31;
  double **ppdVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  long *plVar38;
  ulong uVar39;
  int i_3;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long *plVar44;
  undefined4 in_register_00000034;
  fft_plan *pfVar45;
  undefined8 *puVar46;
  ulong uVar47;
  undefined8 *puVar48;
  ulong uVar49;
  undefined4 in_register_00000084;
  int i;
  int iVar50;
  uint uVar51;
  int count;
  int i_10;
  ulong uVar52;
  int i_11;
  int iVar53;
  long lVar54;
  byte bVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  undefined1 auVar63 [16];
  double dVar62;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  ulong uVar66;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int maximum_number;
  fft_plan forwardFFT;
  fft_plan inverseFFT;
  int in_stack_fffffffffffffd38;
  double *in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd48 [24];
  undefined1 in_stack_fffffffffffffd60 [40];
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  double *in_stack_fffffffffffffda0;
  double local_228;
  int local_218;
  ulong local_1d8;
  ulong local_1b0;
  undefined1 local_e8 [24];
  double *pdStack_d0;
  fft_complex *local_c8;
  fft_complex *padStack_c0;
  double *local_b8;
  fft_complex *padStack_b0;
  double *local_a8;
  double *pdStack_a0;
  int *local_98;
  double *pdStack_90;
  ulong local_88;
  ulong local_80;
  fft_plan local_78;
  
  pdVar30 = (double *)CONCAT44(in_register_00000084,speed);
  bVar55 = 0;
  dVar56 = log((f0_ceil * 1.1) / (f0_floor * 0.9));
  iVar53 = (int)((dVar56 / 0.6931471805599453) * 40.0);
  uVar40 = iVar53 + 1;
  lVar12 = (long)(int)uVar40;
  uVar47 = lVar12 * 8;
  if (iVar53 < -1) {
    uVar47 = 0xffffffffffffffff;
  }
  pdVar13 = (double *)operator_new__(uVar47);
  if (-1 < iVar53) {
    uVar39 = 0;
    do {
      uVar14 = uVar39 + 1;
      dVar56 = exp2((double)(int)uVar14 / 40.0);
      pdVar13[uVar39] = dVar56 * f0_floor * 0.9;
      uVar39 = uVar14;
    } while (uVar40 != uVar14);
    local_228 = *pdVar13;
  }
  iVar35 = 0xc;
  if (frame_period < 0xc) {
    iVar35 = frame_period;
  }
  iVar9 = 1;
  if (1 < iVar35) {
    iVar9 = iVar35;
  }
  dVar57 = (double)x_length;
  dVar56 = (double)iVar9;
  dVar58 = ceil(dVar57 / dVar56);
  uVar33 = (uint)dVar58;
  uVar49 = (ulong)uVar33;
  dVar58 = (double)fs / dVar56;
  uVar7 = GetSuitableFFTSize(uVar33 + (int)((dVar58 + dVar58) / local_228) * 2 + 5);
  lVar41 = (long)(int)uVar7;
  uVar14 = lVar41 * 0x10;
  uVar39 = lVar41 * 8;
  if ((int)uVar7 < 0) {
    uVar14 = 0xffffffffffffffff;
    uVar39 = 0xffffffffffffffff;
  }
  in = (double *)operator_new__(uVar39);
  out = (fft_complex *)operator_new__(uVar14);
  if (0 < (int)uVar7) {
    memset(in,0,lVar41 * 8);
  }
  if (frame_period < 2) {
    if (0 < x_length) {
      memcpy(in,x,(ulong)(uint)x_length << 3);
    }
  }
  else {
    dVar59 = ceil(140.0 / dVar56);
    uVar8 = (uint)(dVar59 * dVar56);
    iVar35 = x_length + uVar8 * 2;
    lVar37 = (long)iVar35;
    uVar36 = 0xffffffffffffffff;
    if (-1 < iVar35) {
      uVar36 = lVar37 * 8;
    }
    pvVar17 = operator_new__(uVar36);
    if (0 < iVar35) {
      memset(pvVar17,0,(ulong)(iVar35 - 1) * 8 + 8);
    }
    uVar88 = SUB84(pvVar17,0);
    uVar89 = (undefined4)((ulong)pvVar17 >> 0x20);
    pdVar20 = (double *)operator_new__(uVar36);
    auVar78 = _DAT_0012b210;
    auVar79 = _DAT_0012aa40;
    if (0 < (int)uVar8) {
      dVar56 = *x;
      lVar43 = (ulong)uVar8 - 1;
      auVar77._8_4_ = (int)lVar43;
      auVar77._0_8_ = lVar43;
      auVar77._12_4_ = (int)((ulong)lVar43 >> 0x20);
      lVar43 = 0;
      auVar77 = auVar77 ^ _DAT_0012aa40;
      auVar73 = _DAT_0012aa30;
      do {
        bVar3 = auVar77._0_4_ < SUB164(auVar73 ^ auVar79,0);
        iVar50 = auVar77._4_4_;
        iVar81 = SUB164(auVar73 ^ auVar79,4);
        if ((bool)(~(iVar50 < iVar81 || iVar81 == iVar50 && bVar3) & 1)) {
          *(double *)((long)pdVar20 + lVar43) = dVar56;
        }
        if (iVar50 >= iVar81 && (iVar81 != iVar50 || !bVar3)) {
          *(double *)((long)pdVar20 + lVar43 + 8) = dVar56;
        }
        lVar54 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + auVar78._0_8_;
        auVar73._8_8_ = lVar54 + auVar78._8_8_;
        lVar43 = lVar43 + 0x10;
      } while ((ulong)(uVar8 + 1 >> 1) << 4 != lVar43);
    }
    iVar50 = x_length + uVar8;
    if (0 < x_length) {
      iVar81 = uVar8 + 1;
      if ((int)(uVar8 + 1) < iVar50) {
        iVar81 = iVar50;
      }
      memcpy(pdVar20 + (int)uVar8,x,(ulong)(~uVar8 + iVar81) * 8 + 8);
    }
    auVar78 = _DAT_0012aa40;
    auVar79 = _DAT_0012aa30;
    if (uVar8 * 2 != uVar8 && SBORROW4(uVar8 * 2,uVar8) == (int)uVar8 < 0) {
      dVar56 = x[(long)x_length + -1];
      lVar43 = (long)iVar50;
      if (lVar37 < lVar43 + 1) {
        lVar37 = lVar43 + 1;
      }
      lVar54 = (lVar37 - lVar43) + -1;
      auVar67._8_4_ = (int)lVar54;
      auVar67._0_8_ = lVar54;
      auVar67._12_4_ = (int)((ulong)lVar54 >> 0x20);
      uVar36 = 0;
      auVar67 = auVar67 ^ _DAT_0012aa40;
      do {
        auVar83._8_4_ = (int)uVar36;
        auVar83._0_8_ = uVar36;
        auVar83._12_4_ = (int)(uVar36 >> 0x20);
        auVar73 = (auVar83 | auVar79) ^ auVar78;
        bVar3 = auVar67._0_4_ < auVar73._0_4_;
        iVar50 = auVar67._4_4_;
        iVar81 = auVar73._4_4_;
        if ((bool)(~(iVar50 < iVar81 || iVar81 == iVar50 && bVar3) & 1)) {
          pdVar20[lVar43 + uVar36] = dVar56;
        }
        if (iVar50 >= iVar81 && (iVar81 != iVar50 || !bVar3)) {
          pdVar20[lVar43 + uVar36 + 1] = dVar56;
        }
        uVar36 = uVar36 + 2;
      } while (((lVar37 - lVar43) + 1U & 0xfffffffffffffffe) != uVar36);
    }
    pdVar21 = (double *)CONCAT44(uVar89,uVar88);
    decimate(pdVar20,iVar35,iVar9,pdVar21);
    if (0 < (int)uVar33) {
      memcpy(in,pdVar21 + (int)uVar8 / iVar9,uVar49 << 3);
    }
    operator_delete__(pdVar20);
    operator_delete__(pdVar21);
    dVar56 = (double)CONCAT44(uVar89,uVar88);
  }
  if (0 < (int)uVar33) {
    dVar59 = 0.0;
    uVar36 = 0;
    do {
      dVar59 = dVar59 + in[uVar36];
      uVar36 = uVar36 + 1;
    } while (uVar33 != uVar36);
    uVar36 = 0;
    do {
      in[uVar36] = in[uVar36] - dVar59 / (double)(int)uVar33;
      uVar36 = uVar36 + 1;
    } while (uVar33 != uVar36);
  }
  if ((int)uVar33 < (int)uVar7) {
    memset(in + (int)uVar33,0,(ulong)(~uVar33 + uVar7) * 8 + 8);
  }
  fft_plan_dft_r2c_1d((fft_plan *)local_e8,uVar7,in,out,3);
  lVar37 = 9;
  pfVar45 = (fft_plan *)local_e8;
  puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
  while( true ) {
    if (lVar37 == 0) break;
    lVar37 = lVar37 + -1;
    *puVar46 = *(undefined8 *)pfVar45;
    pfVar45 = (fft_plan *)((long)pfVar45 + (ulong)bVar55 * -0x10 + 8);
    puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
  }
  p_02.out._0_4_ = SUB84(dVar56,0);
  p_02.n = in_stack_fffffffffffffd60._0_4_;
  p_02.sign = in_stack_fffffffffffffd60._4_4_;
  p_02.flags = in_stack_fffffffffffffd60._8_4_;
  p_02._12_4_ = in_stack_fffffffffffffd60._12_4_;
  p_02.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
  p_02.in = (double *)in_stack_fffffffffffffd60._24_8_;
  p_02.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
  p_02.out._4_4_ = (int)((ulong)dVar56 >> 0x20);
  p_02.input._0_4_ = in_stack_fffffffffffffd90;
  p_02.input._4_4_ = in_stack_fffffffffffffd94;
  p_02.ip._0_4_ = x_length;
  p_02.ip._4_4_ = in_register_00000034;
  p_02.w = in_stack_fffffffffffffda0;
  fft_execute(p_02);
  pfVar45 = (fft_plan *)local_e8;
  puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
  for (lVar37 = 9; lVar37 != 0; lVar37 = lVar37 + -1) {
    *puVar46 = *(undefined8 *)pfVar45;
    pfVar45 = (fft_plan *)((long)pfVar45 + (ulong)bVar55 * -0x10 + 8);
    puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
  }
  p.flags = in_stack_fffffffffffffd48._0_4_;
  p._12_4_ = in_stack_fffffffffffffd48._4_4_;
  p.c_in = (fft_complex *)in_stack_fffffffffffffd48._8_8_;
  p.in = (double *)in_stack_fffffffffffffd48._16_8_;
  p._0_8_ = in_stack_fffffffffffffd40;
  p.c_out = (fft_complex *)in_stack_fffffffffffffd60._0_8_;
  p.out = (double *)in_stack_fffffffffffffd60._8_8_;
  p.input = (double *)in_stack_fffffffffffffd60._16_8_;
  p.ip = (int *)in_stack_fffffffffffffd60._24_8_;
  p.w = (double *)in_stack_fffffffffffffd60._32_8_;
  fft_destroy_plan(p);
  uVar8 = (uint)((dVar57 * 1000.0) / (double)fs);
  uVar34 = uVar8 + 1;
  uVar36 = (ulong)uVar34;
  uVar88 = 0;
  if (-1 < (int)uVar8) {
    uVar15 = 0;
    do {
      pdVar30[uVar15] = (double)(int)uVar15 / 1000.0;
      temporal_positions[uVar15] = 0.0;
      uVar15 = uVar15 + 1;
    } while (uVar36 != uVar15);
  }
  iVar9 = matlab_round((double)(int)uVar40 / 10.0);
  iVar35 = iVar9 * 7;
  lVar37 = (long)(int)uVar34;
  uVar15 = lVar37 * 8;
  if ((int)uVar8 < -1) {
    uVar15 = 0xffffffffffffffff;
  }
  uVar51 = uVar8;
  plVar16 = (long *)operator_new__(uVar15);
  pvVar17 = operator_new__(uVar15);
  if (-1 < (int)uVar8) {
    uVar52 = (long)iVar35 << 3;
    if (iVar9 < 0) {
      uVar52 = 0xffffffffffffffff;
    }
    uVar42 = 0;
    do {
      pvVar18 = operator_new__(uVar52);
      plVar16[uVar42] = (long)pvVar18;
      pvVar18 = operator_new__(uVar52);
      *(void **)((long)pvVar17 + uVar42 * 8) = pvVar18;
      uVar42 = uVar42 + 1;
    } while (uVar36 != uVar42);
  }
  pvVar18 = operator_new__(uVar47);
  if (-1 < iVar53) {
    local_88 = uVar36 * 8;
    uVar47 = 0xffffffffffffffff;
    if (-2 < (int)uVar51) {
      uVar47 = local_88;
    }
    uVar52 = 0;
    do {
      pvVar19 = operator_new__(uVar47);
      *(void **)((long)pvVar18 + uVar52 * 8) = pvVar19;
      uVar52 = uVar52 + 1;
    } while (uVar40 != uVar52);
    uVar52 = 0xffffffffffffffff;
    if (-1 < (int)uVar33) {
      uVar52 = uVar49 * 8;
    }
    uVar8 = uVar33 - 1;
    uVar42 = 0;
    local_80 = uVar47;
    do {
      dVar56 = pdVar13[uVar42];
      pvVar19 = *(void **)((long)pvVar18 + uVar42 * 8);
      pdVar20 = (double *)operator_new__(uVar39);
      uVar10 = matlab_round(dVar58 / dVar56 + dVar58 / dVar56);
      pdVar21 = (double *)operator_new__(uVar39);
      iVar9 = uVar10 * 2 + 1;
      uVar89 = SUB84(pdVar21,0);
      uVar90 = (undefined4)((ulong)pdVar21 >> 0x20);
      NuttallWindow(iVar9,pdVar21);
      dVar57 = (double)CONCAT44(in_register_00000034,x_length);
      if (-1 < (int)uVar10) {
        dVar57 = dVar56 * 6.283185307179586;
        lVar54 = (ulong)uVar10 * 8 + (long)(int)uVar10 * -8 + CONCAT44(uVar90,uVar89);
        lVar43 = 0;
        do {
          dVar59 = cos(((double)(int)((int)lVar43 - uVar10) * dVar57) / dVar58);
          *(double *)(lVar54 + lVar43 * 8) = dVar59 * *(double *)(lVar54 + lVar43 * 8);
          lVar43 = lVar43 + 1;
        } while (uVar10 * 2 + 1 != (int)lVar43);
      }
      if (iVar9 < (int)uVar7) {
        memset((void *)(CONCAT44(uVar90,uVar89) + (long)(int)(uVar10 * 2) * 8 + 8),0,
               (ulong)((uVar7 - 2) + uVar10 * -2) * 8 + 8);
      }
      out_00 = (fft_complex *)operator_new__(uVar14);
      fft_plan_dft_r2c_1d((fft_plan *)local_e8,uVar7,(double *)CONCAT44(uVar90,uVar89),out_00,3);
      lVar43 = 9;
      pfVar45 = (fft_plan *)local_e8;
      puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
      while( true ) {
        if (lVar43 == 0) break;
        lVar43 = lVar43 + -1;
        *puVar46 = *(undefined8 *)pfVar45;
        pfVar45 = (fft_plan *)((long)pfVar45 + (ulong)bVar55 * -0x10 + 8);
        puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
      }
      p_03.out._0_4_ = uVar89;
      p_03.n = in_stack_fffffffffffffd60._0_4_;
      p_03.sign = in_stack_fffffffffffffd60._4_4_;
      p_03.flags = in_stack_fffffffffffffd60._8_4_;
      p_03._12_4_ = in_stack_fffffffffffffd60._12_4_;
      p_03.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
      p_03.in = (double *)in_stack_fffffffffffffd60._24_8_;
      p_03.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
      p_03.out._4_4_ = uVar90;
      p_03.input._0_4_ = uVar51;
      p_03.input._4_4_ = uVar88;
      p_03.ip._0_4_ = SUB84(dVar57,0);
      p_03.ip._4_4_ = (int)((ulong)dVar57 >> 0x20);
      p_03.w = in_stack_fffffffffffffda0;
      fft_execute(p_03);
      dVar59 = (*out)[0];
      dVar61 = (*out)[1];
      uVar47 = (ulong)DAT_0012b350;
      dVar62 = (*out_00)[0];
      dVar1 = (*out_00)[1];
      (*out_00)[0] = dVar59 * dVar62 + dVar1 * (double)((ulong)dVar61 ^ uVar47);
      (*out_00)[1] = dVar59 * dVar1 + dVar62 * dVar61;
      if (1 < (int)uVar7) {
        padVar22 = out_00 + lVar41 + -2;
        lVar43 = 0;
        do {
          dVar59 = *(double *)((long)out[1] + lVar43);
          dVar61 = *(double *)((long)out[1] + lVar43 + 8);
          pdVar21 = (double *)((long)out_00[1] + lVar43);
          dVar62 = *pdVar21;
          dVar1 = pdVar21[1];
          dVar60 = dVar59 * dVar62 + dVar1 * (double)((ulong)dVar61 ^ uVar47);
          dVar59 = dVar59 * dVar1 + dVar62 * dVar61;
          pdVar21 = (double *)((long)out_00[1] + lVar43);
          *pdVar21 = dVar60;
          pdVar21[1] = dVar59;
          (*padVar22)[0] = dVar60;
          (*padVar22)[1] = dVar59;
          lVar43 = lVar43 + 0x10;
          padVar22 = padVar22 + -1;
        } while ((ulong)(uVar7 & 0xfffffffe) << 3 != lVar43);
      }
      fft_plan_dft_c2r_1d(&local_78,uVar7,out_00,pdVar20,3);
      lVar43 = 9;
      pfVar45 = &local_78;
      puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
      while( true ) {
        if (lVar43 == 0) break;
        lVar43 = lVar43 + -1;
        *puVar46 = *(undefined8 *)pfVar45;
        pfVar45 = (fft_plan *)((long)pfVar45 + (ulong)bVar55 * -0x10 + 8);
        puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
      }
      p_04.out._0_4_ = uVar89;
      p_04.n = in_stack_fffffffffffffd60._0_4_;
      p_04.sign = in_stack_fffffffffffffd60._4_4_;
      p_04.flags = in_stack_fffffffffffffd60._8_4_;
      p_04._12_4_ = in_stack_fffffffffffffd60._12_4_;
      p_04.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
      p_04.in = (double *)in_stack_fffffffffffffd60._24_8_;
      p_04.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
      p_04.out._4_4_ = uVar90;
      p_04.input._0_4_ = uVar51;
      p_04.input._4_4_ = uVar88;
      p_04.ip._0_4_ = SUB84(dVar57,0);
      p_04.ip._4_4_ = (int)((ulong)dVar57 >> 0x20);
      p_04.w = in_stack_fffffffffffffda0;
      fft_execute(p_04);
      pdVar21 = pdVar20;
      uVar47 = uVar49;
      if (0 < (int)uVar33) {
        do {
          *pdVar21 = pdVar21[(long)(int)uVar10 + 1];
          uVar47 = uVar47 - 1;
          pdVar21 = pdVar21 + 1;
        } while (uVar47 != 0);
      }
      pfVar45 = &local_78;
      puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
      for (lVar43 = 9; lVar43 != 0; lVar43 = lVar43 + -1) {
        *puVar46 = *(undefined8 *)pfVar45;
        pfVar45 = (fft_plan *)((long)pfVar45 + ((ulong)bVar55 * -2 + 1) * 8);
        puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
      }
      p_00.flags = in_stack_fffffffffffffd48._0_4_;
      p_00._12_4_ = in_stack_fffffffffffffd48._4_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffd48._8_8_;
      p_00.in = (double *)in_stack_fffffffffffffd48._16_8_;
      p_00._0_8_ = in_stack_fffffffffffffd40;
      p_00.c_out = (fft_complex *)in_stack_fffffffffffffd60._0_8_;
      p_00.out = (double *)in_stack_fffffffffffffd60._8_8_;
      p_00.input = (double *)in_stack_fffffffffffffd60._16_8_;
      p_00.ip = (int *)in_stack_fffffffffffffd60._24_8_;
      p_00.w = (double *)in_stack_fffffffffffffd60._32_8_;
      fft_destroy_plan(p_00);
      puVar46 = (undefined8 *)local_e8;
      puVar48 = (undefined8 *)&stack0xfffffffffffffd38;
      for (lVar43 = 9; lVar43 != 0; lVar43 = lVar43 + -1) {
        *puVar48 = *puVar46;
        puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
        puVar48 = puVar48 + (ulong)bVar55 * -2 + 1;
      }
      p_01.flags = in_stack_fffffffffffffd48._0_4_;
      p_01._12_4_ = in_stack_fffffffffffffd48._4_4_;
      p_01.c_in = (fft_complex *)in_stack_fffffffffffffd48._8_8_;
      p_01.in = (double *)in_stack_fffffffffffffd48._16_8_;
      p_01._0_8_ = in_stack_fffffffffffffd40;
      p_01.c_out = (fft_complex *)in_stack_fffffffffffffd60._0_8_;
      p_01.out = (double *)in_stack_fffffffffffffd60._8_8_;
      p_01.input = (double *)in_stack_fffffffffffffd60._16_8_;
      p_01.ip = (int *)in_stack_fffffffffffffd60._24_8_;
      p_01.w = (double *)in_stack_fffffffffffffd60._32_8_;
      fft_destroy_plan(p_01);
      operator_delete__(out_00);
      operator_delete__((void *)CONCAT44(uVar90,uVar89));
      pdVar21 = (double *)operator_new__(uVar52);
      pdVar23 = (double *)operator_new__(uVar52);
      pvVar24 = operator_new__(uVar52);
      x_length = (int)pvVar24;
      in_register_00000034 = (undefined4)((ulong)pvVar24 >> 0x20);
      pvVar24 = operator_new__(uVar52);
      uVar89 = SUB84(pvVar24,0);
      uVar90 = (undefined4)((ulong)pvVar24 >> 0x20);
      intervals = (double *)operator_new__(uVar52);
      intervals_00 = (double *)operator_new__(uVar52);
      intervals_01 = (double *)operator_new__(uVar52);
      intervals_02 = (double *)operator_new__(uVar52);
      uVar10 = ZeroCrossingEngine(pdVar20,uVar33,dVar58,pdVar21,intervals);
      if ((int)uVar33 < 1) {
        iVar9 = ZeroCrossingEngine(pdVar20,uVar33,dVar58,pdVar23,intervals_00);
LAB_00123c81:
        uVar11 = ZeroCrossingEngine(pdVar20,uVar8,dVar58,
                                    (double *)CONCAT44(in_register_00000034,x_length),intervals_01);
      }
      else {
        uVar47 = 0;
        uVar66 = (ulong)DAT_0012b350;
        do {
          pdVar20[uVar47] = (double)((ulong)pdVar20[uVar47] ^ uVar66);
          uVar47 = uVar47 + 1;
        } while (uVar49 != uVar47);
        iVar9 = ZeroCrossingEngine(pdVar20,uVar33,dVar58,pdVar23,intervals_00);
        if (uVar33 == 1) goto LAB_00123c81;
        uVar47 = 0;
        dVar57 = *pdVar20;
        do {
          lVar43 = uVar47 + 1;
          pdVar20[uVar47] = dVar57 - pdVar20[lVar43];
          uVar47 = uVar47 + 1;
          dVar57 = pdVar20[lVar43];
        } while (uVar8 != uVar47);
        uVar11 = ZeroCrossingEngine(pdVar20,uVar8,dVar58,
                                    (double *)CONCAT44(in_register_00000034,x_length),intervals_01);
        uVar47 = 0;
        uVar66 = (ulong)DAT_0012b350;
        do {
          pdVar20[uVar47] = (double)((ulong)pdVar20[uVar47] ^ uVar66);
          uVar47 = uVar47 + 1;
        } while (uVar8 != uVar47);
      }
      x_length_00 = ZeroCrossingEngine(pdVar20,uVar8,dVar58,(double *)CONCAT44(uVar90,uVar89),
                                       intervals_02);
      uVar47 = local_80;
      if ((((uVar10 < 3) || (iVar9 < 3)) || (uVar11 < 3)) || (x_length_00 < 3)) {
        if (-1 < (int)uVar51) {
          memset(pvVar19,0,local_88);
        }
      }
      else {
        lVar43 = 0;
        do {
          pvVar24 = operator_new__(uVar47);
          *(void **)(local_e8 + lVar43 * 8) = pvVar24;
          uVar2 = local_e8._0_8_;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
        interp1(pdVar21,intervals,uVar10,pdVar30,uVar34,(double *)local_e8._0_8_);
        uVar4 = local_e8._8_8_;
        interp1(pdVar23,intervals_00,iVar9,pdVar30,uVar34,(double *)local_e8._8_8_);
        uVar5 = local_e8._16_8_;
        interp1((double *)CONCAT44(in_register_00000034,x_length),intervals_01,uVar11,pdVar30,uVar34
                ,(double *)local_e8._16_8_);
        pdVar6 = pdStack_d0;
        interp1((double *)CONCAT44(uVar90,uVar89),intervals_02,x_length_00,pdVar30,uVar34,pdStack_d0
               );
        if (-1 < (int)uVar51) {
          uVar47 = 0;
          do {
            dVar57 = (*(double *)(uVar2 + uVar47 * 8) + *(double *)(uVar4 + uVar47 * 8) +
                      ((double *)uVar5)[uVar47] + pdVar6[uVar47]) * 0.25;
            *(ulong *)((long)pvVar19 + uVar47 * 8) =
                 ~-(ulong)(dVar57 < f0_floor) &
                 ~-(ulong)(f0_ceil < dVar57) &
                 ~-(ulong)(dVar56 * 1.1 < dVar57) & ~-(ulong)(dVar57 < dVar56 * 0.9) & (ulong)dVar57
            ;
            uVar47 = uVar47 + 1;
          } while (uVar36 != uVar47);
        }
        lVar43 = 0;
        do {
          if (*(void **)(local_e8 + lVar43 * 8) != (void *)0x0) {
            operator_delete__(*(void **)(local_e8 + lVar43 * 8));
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 != 4);
      }
      operator_delete__(pdVar21);
      operator_delete__(pdVar23);
      operator_delete__((void *)CONCAT44(in_register_00000034,x_length));
      operator_delete__((void *)CONCAT44(uVar90,uVar89));
      operator_delete__(intervals);
      operator_delete__(intervals_00);
      operator_delete__(intervals_01);
      operator_delete__(intervals_02);
      operator_delete__(pdVar20);
      dVar56 = (double)CONCAT44(uVar90,uVar89);
      uVar42 = uVar42 + 1;
    } while (uVar42 != uVar40);
  }
  uVar47 = 0xffffffffffffffff;
  if (-2 < iVar53) {
    uVar47 = lVar12 * 4;
  }
  puVar25 = (undefined4 *)operator_new__(uVar47);
  pvVar24 = operator_new__(uVar47);
  pvVar19 = operator_new__(uVar47);
  uVar89 = SUB84(pvVar19,0);
  uVar90 = (undefined4)((ulong)pvVar19 >> 0x20);
  if ((int)uVar51 < 0) {
    uVar47 = 0;
  }
  else {
    uVar47 = 0;
    uVar7 = 0;
    do {
      uVar91 = (undefined4)((ulong)dVar56 >> 0x20);
      if (iVar53 < 0) {
LAB_001240b8:
        lVar41 = plVar16[uVar47];
        uVar10 = 0;
        uVar8 = SUB84(dVar56,0);
      }
      else {
        uVar39 = 0;
        do {
          puVar25[uVar39] =
               (uint)(0.0 < *(double *)(*(long *)((long)pvVar18 + uVar39 * 8) + uVar47 * 8));
          uVar39 = uVar39 + 1;
        } while (uVar40 != uVar39);
        puVar25[lVar12 + -1] = 0;
        *puVar25 = 0;
        if (iVar53 < 1) goto LAB_001240b8;
        uVar11 = 0;
        uVar39 = 1;
        do {
          pvVar26 = pvVar24;
          uVar8 = uVar11;
          if (puVar25[uVar39] - puVar25[uVar39 - 1] == 1) {
LAB_00124045:
            *(int *)((long)pvVar26 + (long)(int)uVar11 * 4) = (int)uVar39;
            uVar11 = uVar8;
          }
          else if (puVar25[uVar39] - puVar25[uVar39 - 1] == -1) {
            uVar8 = uVar11 + 1;
            pvVar26 = pvVar19;
            goto LAB_00124045;
          }
          uVar39 = uVar39 + 1;
        } while (uVar40 != uVar39);
        lVar41 = plVar16[uVar47];
        uVar8 = uVar7;
        if ((int)uVar11 < 1) {
          uVar10 = 0;
        }
        else {
          uVar39 = 0;
          uVar10 = 0;
          do {
            iVar9 = *(int *)((long)pvVar19 + uVar39 * 4);
            iVar50 = *(int *)((long)pvVar24 + uVar39 * 4);
            lVar43 = (long)iVar50;
            if (9 < iVar9 - iVar50) {
              dVar56 = 0.0;
              if (iVar50 < iVar9) {
                do {
                  dVar56 = dVar56 + *(double *)(*(long *)((long)pvVar18 + lVar43 * 8) + uVar47 * 8);
                  lVar43 = lVar43 + 1;
                } while (iVar9 != lVar43);
              }
              lVar43 = (long)(int)uVar10;
              uVar10 = uVar10 + 1;
              *(double *)(lVar41 + lVar43 * 8) = dVar56 / (double)(iVar9 - iVar50);
              pvVar19 = (void *)CONCAT44(uVar90,uVar89);
            }
            uVar39 = uVar39 + 1;
          } while (uVar39 != uVar11);
        }
      }
      if ((int)uVar10 < iVar35) {
        memset((void *)(lVar41 + (long)(int)uVar10 * 8),0,(ulong)(~uVar10 + iVar35) * 8 + 8);
        pvVar19 = (void *)CONCAT44(uVar90,uVar89);
      }
      dVar56 = (double)CONCAT44(uVar91,uVar8);
      if ((int)uVar7 <= (int)uVar10) {
        uVar7 = uVar10;
      }
      uVar47 = uVar47 + 1;
    } while (uVar47 != uVar36);
    uVar47 = (ulong)uVar7;
  }
  operator_delete__(puVar25);
  operator_delete__(pvVar24);
  operator_delete__((void *)CONCAT44(uVar90,uVar89));
  lVar12 = uVar36 * 8;
  lVar41 = 1;
  lVar43 = 8;
  plVar38 = plVar16;
  uVar7 = uVar51;
  do {
    lVar12 = lVar12 + -8;
    plVar38 = plVar38 + 1;
    local_218 = (int)uVar47;
    if (0 < local_218) {
      uVar39 = 0;
      do {
        if (lVar41 < lVar37) {
          lVar54 = 0;
          do {
            *(undefined8 *)
             (*(long *)((long)plVar38 + lVar54) + uVar39 * 8 +
             (ulong)(uint)(local_218 * (int)lVar41) * 8) =
                 *(undefined8 *)(*(long *)((long)plVar16 + lVar54) + uVar39 * 8);
            lVar54 = lVar54 + 8;
            plVar44 = plVar16;
            uVar14 = (ulong)uVar7;
          } while (lVar12 != lVar54);
          do {
            *(undefined8 *)
             (*plVar44 + uVar39 * 8 + (ulong)(uint)(((int)lVar41 + 3) * local_218) * 8) =
                 *(undefined8 *)(*(long *)((long)plVar44 + lVar43) + uVar39 * 8);
            uVar14 = uVar14 - 1;
            plVar44 = plVar44 + 1;
          } while (uVar14 != 0);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar47);
    }
    lVar41 = lVar41 + 1;
    uVar7 = uVar7 - 1;
    lVar43 = lVar43 + 8;
  } while (lVar41 != 4);
  if (-1 < iVar53) {
    uVar47 = 0;
    do {
      pvVar19 = *(void **)((long)pvVar18 + uVar47 * 8);
      if (pvVar19 != (void *)0x0) {
        operator_delete__(pvVar19);
      }
      uVar47 = uVar47 + 1;
    } while (uVar40 != uVar47);
  }
  operator_delete__(pvVar18);
  uVar40 = local_218 * 7;
  local_1d8 = (ulong)uVar40;
  if ((int)uVar51 < 0) {
    uVar47 = 0xffffffffffffffff;
    if (-2 < (int)uVar51) {
      uVar47 = uVar36 * 8;
    }
    uVar7 = uVar51;
    pvVar18 = operator_new__(uVar47);
  }
  else {
    uVar47 = (ulong)uVar40;
    local_1b0 = 0;
    do {
      if (0 < local_218) {
        lVar12 = plVar16[local_1b0];
        lVar41 = *(long *)((long)pvVar17 + local_1b0 * 8);
        uVar39 = 0;
        do {
          dVar57 = *(double *)(lVar12 + uVar39 * 8);
          if (dVar57 <= 0.0) {
            *(undefined8 *)(lVar12 + uVar39 * 8) = 0;
            *(undefined8 *)(lVar41 + uVar39 * 8) = 0;
          }
          else {
            dVar59 = pdVar30[local_1b0];
            dVar61 = (dVar58 * 1.5) / dVar57 + 1.0;
            dVar62 = 0.0;
            iVar53 = (int)dVar61;
            uVar8 = iVar53 * 2;
            uVar49 = (ulong)uVar8;
            uVar7 = iVar53 * 2 + 1;
            uVar52 = (ulong)(int)uVar7;
            uVar14 = uVar52 * 8;
            if (iVar53 < 0) {
              uVar14 = 0xffffffffffffffff;
            }
            pdVar20 = (double *)operator_new__(uVar14);
            auVar78 = _DAT_0012b210;
            auVar79 = _DAT_0012aa40;
            if (-1 < iVar53) {
              uVar42 = 0;
              if (0 < (int)uVar8) {
                uVar42 = uVar49;
              }
              auVar63._8_4_ = (int)uVar42;
              auVar63._0_8_ = uVar42;
              auVar63._12_4_ = 0;
              iVar35 = -iVar53;
              lVar43 = 0;
              auVar68 = _DAT_0012aa30;
              do {
                auVar73 = auVar63 ^ auVar79;
                auVar77 = auVar68 ^ auVar79;
                bVar3 = auVar73._0_4_ < auVar77._0_4_;
                iVar9 = auVar73._4_4_;
                iVar50 = auVar77._4_4_;
                if ((bool)(~(iVar9 < iVar50 || iVar50 == iVar9 && bVar3) & 1)) {
                  *(double *)((long)pdVar20 + lVar43) = (double)iVar35 / dVar58;
                }
                if (iVar9 >= iVar50 && (iVar50 != iVar9 || !bVar3)) {
                  *(double *)((long)pdVar20 + lVar43 + 8) = (double)(iVar35 + 1) / dVar58;
                }
                lVar54 = auVar68._8_8_;
                auVar68._0_8_ = auVar68._0_8_ + auVar78._0_8_;
                auVar68._8_8_ = lVar54 + auVar78._8_8_;
                lVar43 = lVar43 + 0x10;
                iVar35 = iVar35 + 2;
              } while (uVar42 * 8 + 0x10 != lVar43);
            }
            pdVar21 = (double *)(double)(int)dVar62;
            dVar61 = (double)(int)dVar61 + (double)(int)dVar61 + 1.0;
            dVar62 = log(dVar61);
            dVar62 = exp2((double)(int)(dVar62 / 0.6931471805599453) + 2.0);
            uVar10 = (uint)dVar62;
            local_98 = (int *)0x0;
            pdStack_90 = (double *)0x0;
            local_a8 = (double *)0x0;
            pdStack_a0 = (double *)0x0;
            local_b8 = (double *)0x0;
            padStack_b0 = (fft_complex *)0x0;
            local_c8 = (fft_complex *)0x0;
            padStack_c0 = (fft_complex *)0x0;
            local_e8._16_8_ = (fft_complex *)0x0;
            pdStack_d0 = (double *)0x0;
            local_e8._0_8_ = (double *)0x0;
            local_e8._8_8_ = (double *)0x0;
            InitializeForwardRealFFT(uVar10,(ForwardRealFFT *)local_e8);
            uVar42 = (ulong)uVar10 << 4;
            if ((int)uVar10 < 0) {
              uVar42 = 0xffffffffffffffff;
            }
            pvVar18 = operator_new__(uVar42);
            pvVar19 = operator_new__(uVar42);
            uVar42 = uVar52 * 4;
            if (iVar53 < 0) {
              uVar42 = 0xffffffffffffffff;
            }
            pvVar24 = operator_new__(uVar42);
            pvVar26 = operator_new__(uVar14);
            pdVar23 = (double *)operator_new__(uVar14);
            iVar35 = matlab_round((*pdVar20 + dVar59) * dVar58 + 0.001);
            auVar78 = _DAT_0012b210;
            auVar79 = _DAT_0012aa40;
            if (iVar53 < 0) {
              *pdVar23 = NAN;
              uVar14 = (ulong)uVar7;
            }
            else {
              dVar61 = dVar61 / dVar58;
              auVar64._4_4_ = 0;
              auVar64._0_4_ = uVar8;
              auVar64._8_4_ = uVar8;
              auVar64._12_4_ = 0;
              lVar43 = 0;
              auVar69 = _DAT_0012aa30;
              do {
                auVar73 = auVar64 ^ auVar79;
                auVar77 = auVar69 ^ auVar79;
                bVar3 = auVar73._0_4_ < auVar77._0_4_;
                iVar9 = auVar73._4_4_;
                iVar50 = auVar77._4_4_;
                if ((bool)(~(iVar9 < iVar50 || iVar50 == iVar9 && bVar3) & 1)) {
                  *(int *)((long)pvVar24 + lVar43) = iVar35;
                }
                if (iVar9 >= iVar50 && (iVar50 != iVar9 || !bVar3)) {
                  *(int *)((long)pvVar24 + lVar43 + 4) = iVar35 + 1;
                }
                lVar54 = auVar69._8_8_;
                auVar69._0_8_ = auVar69._0_8_ + auVar78._0_8_;
                auVar69._8_8_ = lVar54 + auVar78._8_8_;
                lVar43 = lVar43 + 8;
                iVar35 = iVar35 + 2;
              } while (uVar49 * 4 + 8 != lVar43);
              lVar43 = 0;
              do {
                dVar62 = ((double)*(int *)((long)pvVar24 + lVar43 * 4) + -1.0) / dVar58 - dVar59;
                dVar56 = cos((dVar62 * 6.283185307179586) / dVar61);
                dVar56 = dVar56 * 0.5 + 0.42;
                dVar62 = cos((dVar62 * 12.566370614359172) / dVar61);
                *(double *)((long)pvVar26 + lVar43 * 8) = dVar62 * 0.08 + dVar56;
                lVar43 = lVar43 + 1;
              } while (uVar49 + 1 != lVar43);
              *pdVar23 = *(double *)((long)pvVar26 + 8) * -0.5;
              uVar14 = uVar52;
              if (iVar53 != 0) {
                lVar43 = 0;
                do {
                  pdVar23[lVar43 + 1] =
                       (*(double *)((long)pvVar26 + lVar43 * 8 + 0x10) -
                       *(double *)((long)pvVar26 + lVar43 * 8)) * -0.5;
                  lVar43 = lVar43 + 1;
                } while (uVar49 - 1 != lVar43);
              }
            }
            uVar49 = uVar14 * 4;
            pdVar23[(int)uVar8] = *(double *)((long)pvVar26 + uVar52 * 8 + -0x10) * 0.5;
            if (iVar53 < 0) {
              uVar49 = 0xffffffffffffffff;
            }
            pvVar27 = operator_new__(uVar49);
            if (-1 < iVar53) {
              uVar49 = 0;
              do {
                iVar35 = *(int *)((long)pvVar24 + uVar49 * 4) + -1;
                if ((int)(uVar33 - 1) < iVar35) {
                  iVar35 = uVar33 - 1;
                }
                if (iVar35 < 1) {
                  iVar35 = 0;
                }
                *(int *)((long)pvVar27 + uVar49 * 4) = iVar35;
                uVar49 = uVar49 + 1;
              } while (uVar14 != uVar49);
              uVar49 = 0;
              do {
                *(double *)(local_e8._8_8_ + uVar49 * 8) =
                     in[*(int *)((long)pvVar27 + uVar49 * 4)] *
                     *(double *)((long)pvVar26 + uVar49 * 8);
                uVar49 = uVar49 + 1;
              } while (uVar14 != uVar49);
            }
            if ((int)uVar7 < (int)uVar10) {
              memset((double *)(local_e8._8_8_ + uVar52 * 8),0,
                     (ulong)((uVar8 ^ 0xfffffffe) + uVar10) * 8 + 8);
            }
            lVar43 = 9;
            ppdVar32 = &pdStack_d0;
            puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
            while( true ) {
              if (lVar43 == 0) break;
              lVar43 = lVar43 + -1;
              *puVar46 = *ppdVar32;
              ppdVar32 = ppdVar32 + (ulong)bVar55 * -2 + 1;
              puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
            }
            p_05.out._0_4_ = SUB84(dVar56,0);
            p_05.n = in_stack_fffffffffffffd60._0_4_;
            p_05.sign = in_stack_fffffffffffffd60._4_4_;
            p_05.flags = in_stack_fffffffffffffd60._8_4_;
            p_05._12_4_ = in_stack_fffffffffffffd60._12_4_;
            p_05.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
            p_05.in = (double *)in_stack_fffffffffffffd60._24_8_;
            p_05.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
            p_05.out._4_4_ = (int)((ulong)dVar56 >> 0x20);
            p_05.input._0_4_ = uVar51;
            p_05.input._4_4_ = uVar88;
            p_05.ip._0_4_ = SUB84(dVar61,0);
            p_05.ip._4_4_ = (int)((ulong)dVar61 >> 0x20);
            p_05.w = pdVar21;
            fft_execute(p_05);
            iVar35 = (int)uVar10 / 2;
            if (-2 < (int)uVar10) {
              lVar43 = 0;
              do {
                *(undefined8 *)((long)pvVar18 + lVar43) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar43);
                *(undefined8 *)((long)pvVar18 + lVar43 + 8) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar43 + 8);
                lVar43 = lVar43 + 0x10;
              } while ((ulong)(iVar35 + 1) << 4 != lVar43);
            }
            if (-1 < iVar53) {
              uVar49 = 0;
              do {
                *(double *)(local_e8._8_8_ + uVar49 * 8) =
                     in[*(int *)((long)pvVar27 + uVar49 * 4)] * pdVar23[uVar49];
                uVar49 = uVar49 + 1;
              } while (uVar14 != uVar49);
            }
            if ((int)uVar7 < (int)uVar10) {
              memset((double *)(local_e8._8_8_ + uVar52 * 8),0,
                     (ulong)((uVar8 ^ 0xfffffffe) + uVar10) * 8 + 8);
            }
            lVar43 = 9;
            ppdVar32 = &pdStack_d0;
            puVar46 = (undefined8 *)&stack0xfffffffffffffd38;
            while( true ) {
              if (lVar43 == 0) break;
              lVar43 = lVar43 + -1;
              *puVar46 = *ppdVar32;
              ppdVar32 = ppdVar32 + (ulong)bVar55 * -2 + 1;
              puVar46 = puVar46 + (ulong)bVar55 * -2 + 1;
            }
            p_06.out._0_4_ = SUB84(dVar56,0);
            p_06.n = in_stack_fffffffffffffd60._0_4_;
            p_06.sign = in_stack_fffffffffffffd60._4_4_;
            p_06.flags = in_stack_fffffffffffffd60._8_4_;
            p_06._12_4_ = in_stack_fffffffffffffd60._12_4_;
            p_06.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
            p_06.in = (double *)in_stack_fffffffffffffd60._24_8_;
            p_06.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
            p_06.out._4_4_ = (int)((ulong)dVar56 >> 0x20);
            p_06.input._0_4_ = uVar51;
            p_06.input._4_4_ = uVar88;
            p_06.ip._0_4_ = SUB84(dVar61,0);
            p_06.ip._4_4_ = (int)((ulong)dVar61 >> 0x20);
            p_06.w = pdVar21;
            fft_execute(p_06);
            if ((int)uVar10 < -1) {
              uVar14 = (ulong)(iVar35 + 1);
            }
            else {
              uVar14 = (ulong)(iVar35 + 1);
              lVar43 = 0;
              do {
                *(undefined8 *)((long)pvVar19 + lVar43) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar43);
                *(undefined8 *)((long)pvVar19 + lVar43 + 8) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar43 + 8);
                lVar43 = lVar43 + 0x10;
              } while (uVar14 << 4 != lVar43);
            }
            operator_delete__(pvVar27);
            uVar49 = (long)(int)uVar14 << 3;
            if ((int)uVar10 < -3) {
              uVar49 = 0xffffffffffffffff;
            }
            pvVar27 = operator_new__(uVar49);
            pvVar28 = operator_new__(uVar49);
            if (-2 < (int)uVar10) {
              lVar43 = 0;
              do {
                dVar56 = *(double *)((long)pvVar18 + lVar43 * 2);
                dVar59 = *(double *)((long)pvVar18 + lVar43 * 2 + 8);
                *(double *)((long)pvVar28 + lVar43) =
                     *(double *)((long)pvVar19 + lVar43 * 2 + 8) * dVar56 -
                     *(double *)((long)pvVar19 + lVar43 * 2) * dVar59;
                *(double *)((long)pvVar27 + lVar43) = dVar56 * dVar56 + dVar59 * dVar59;
                lVar43 = lVar43 + 8;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            uVar89 = SUB84(pvVar28,0);
            uVar90 = (undefined4)((ulong)pvVar28 >> 0x20);
            uVar7 = (uint)((dVar58 * 0.5) / dVar57);
            uVar14 = 6;
            if ((int)uVar7 < 6) {
              uVar14 = (ulong)uVar7;
            }
            uVar49 = uVar14 * 8;
            if ((int)uVar7 < 0) {
              uVar49 = 0xffffffffffffffff;
            }
            pvVar28 = operator_new__(uVar49);
            pvVar29 = operator_new__(uVar49);
            if ((int)uVar7 < 1) {
              dVar56 = 0.0;
              dVar59 = 0.0;
            }
            else {
              dVar56 = ((double)(int)uVar10 * dVar57) / dVar58;
              uVar49 = 0;
              do {
                uVar52 = uVar49 + 1;
                iVar53 = matlab_round((double)(int)uVar52 * dVar56);
                dVar59 = *(double *)((long)pvVar27 + (long)iVar53 * 8);
                dVar61 = 0.0;
                if ((dVar59 != 0.0) || (NAN(dVar59))) {
                  auVar78._0_8_ = (double)iVar53 * dVar58;
                  auVar78._8_8_ =
                       (*(double *)(CONCAT44(uVar90,uVar89) + (long)iVar53 * 8) / dVar59) * dVar58 *
                       0.5;
                  auVar79._8_8_ = 0x400921fb54442d18;
                  auVar79._0_8_ = (double)(int)uVar10;
                  auVar79 = divpd(auVar78,auVar79);
                  dVar61 = auVar79._8_8_ + auVar79._0_8_;
                }
                *(double *)((long)pvVar29 + uVar49 * 8) = dVar61;
                if (dVar59 < 0.0) {
                  dVar59 = sqrt(dVar59);
                }
                else {
                  dVar59 = SQRT(dVar59);
                }
                *(double *)((long)pvVar28 + uVar49 * 8) = dVar59;
                uVar49 = uVar52;
              } while (uVar14 != uVar52);
              dVar59 = 0.0;
              dVar61 = 0.0;
              dVar56 = 0.0;
              uVar49 = 0;
              do {
                dVar62 = *(double *)((long)pvVar29 + uVar49 * 8);
                dVar1 = *(double *)((long)pvVar28 + uVar49 * 8);
                uVar49 = uVar49 + 1;
                dVar59 = dVar59 + dVar62 * dVar1;
                dVar61 = dVar61 + (double)(int)uVar49 * dVar1;
                dVar56 = dVar56 + (double)((ulong)((dVar62 / (double)(int)uVar49 - dVar57) / dVar57)
                                          & (ulong)DAT_0012abb0);
              } while (uVar14 != uVar49);
              dVar59 = dVar59 / (dVar61 + 1e-12);
            }
            *(double *)(lVar41 + uVar39 * 8) = dVar56;
            *(double *)(lVar12 + uVar39 * 8) = dVar59;
            *(double *)(lVar41 + uVar39 * 8) =
                 1.0 / (*(double *)(lVar41 + uVar39 * 8) / (double)(int)uVar14 + 1e-12);
            operator_delete__(pvVar28);
            operator_delete__(pvVar29);
            operator_delete__(pvVar19);
            operator_delete__(pdVar23);
            operator_delete__(pvVar26);
            operator_delete__(pvVar24);
            operator_delete__((void *)CONCAT44(uVar90,uVar89));
            operator_delete__(pvVar27);
            operator_delete__(pvVar18);
            DestroyForwardRealFFT((ForwardRealFFT *)local_e8);
            dVar56 = *(double *)(lVar12 + uVar39 * 8);
            if (((dVar56 < f0_floor) || (f0_ceil < dVar56)) ||
               (pdVar21 = (double *)(lVar41 + uVar39 * 8), *pdVar21 <= 2.5 && *pdVar21 != 2.5)) {
              *(undefined8 *)(lVar12 + uVar39 * 8) = 0;
              *(undefined8 *)(lVar41 + uVar39 * 8) = 0;
            }
            operator_delete__(pdVar20);
            dVar56 = (double)CONCAT44(uVar90,uVar89);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar47);
      }
      local_1b0 = local_1b0 + 1;
    } while (local_1b0 != uVar36);
    pvVar18 = operator_new__(uVar36 * 8);
    uVar39 = 0xffffffffffffffff;
    if (-1 < local_218) {
      uVar39 = uVar47 * 8;
    }
    uVar14 = 0;
    do {
      pvVar19 = operator_new__(uVar39);
      *(void **)((long)pvVar18 + uVar14 * 8) = pvVar19;
      uVar14 = uVar14 + 1;
    } while (uVar36 != uVar14);
    uVar39 = 0;
    do {
      if (0 < local_218) {
        lVar12 = plVar16[uVar39];
        lVar41 = *(long *)((long)pvVar18 + uVar39 * 8);
        uVar14 = 0;
        do {
          *(undefined8 *)(lVar41 + uVar14 * 8) = *(undefined8 *)(lVar12 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar47 != uVar14);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar36);
    if (1 < (int)uVar51) {
      uVar39 = 1;
      do {
        if (0 < local_218) {
          lVar12 = plVar16[uVar39];
          uVar14 = 0;
          do {
            dVar56 = *(double *)(lVar12 + uVar14 * 8);
            if ((dVar56 != 0.0) || (NAN(dVar56))) {
              dVar58 = 1.0;
              dVar57 = 1.0;
              uVar49 = 0;
              do {
                dVar59 = ABS(dVar56 - *(double *)
                                       (*(long *)((long)pvVar18 + uVar39 * 8 + 8) + uVar49 * 8)) /
                         dVar56;
                dVar57 = (double)(-(ulong)(dVar58 < dVar59) & (ulong)dVar57 |
                                 ~-(ulong)(dVar58 < dVar59) & (ulong)dVar59);
                if (dVar59 <= dVar58) {
                  dVar58 = dVar59;
                }
                uVar49 = uVar49 + 1;
              } while (uVar47 != uVar49);
              auVar82 = ZEXT816(0x3ff0000000000000);
              auVar79 = ZEXT816(0x3ff0000000000000);
              uVar49 = 0;
              do {
                dVar58 = ABS(dVar56 - *(double *)
                                       (*(long *)((long)pvVar18 + uVar39 * 8 + -8) + uVar49 * 8)) /
                         dVar56;
                uVar52 = -(ulong)(auVar82._0_8_ < dVar58);
                auVar86._0_8_ = ~uVar52 & (ulong)dVar58;
                auVar86._8_8_ = 0;
                auVar84._0_8_ = uVar52 & auVar79._0_8_;
                auVar84._8_8_ = auVar82._8_8_ & auVar79._8_8_;
                auVar79 = auVar84 | auVar86;
                if (dVar58 <= auVar82._0_8_) {
                  auVar82._0_8_ = dVar58;
                }
                uVar49 = uVar49 + 1;
              } while (uVar47 != uVar49);
              if (auVar79._0_8_ <= dVar57) {
                dVar57 = auVar79._0_8_;
              }
              if (0.05 < dVar57) {
                *(undefined8 *)(lVar12 + uVar14 * 8) = 0;
                *(undefined8 *)(*(long *)((long)pvVar17 + uVar39 * 8) + uVar14 * 8) = 0;
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar47);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar51);
    }
    uVar47 = 0;
    do {
      pvVar19 = *(void **)((long)pvVar18 + uVar47 * 8);
      if (pvVar19 != (void *)0x0) {
        operator_delete__(pvVar19);
      }
      uVar47 = uVar47 + 1;
      uVar7 = uVar51;
    } while (uVar36 != uVar47);
  }
  operator_delete__(pvVar18);
  pvVar18 = operator_new__(uVar15);
  pdVar20 = (double *)operator_new__(uVar15);
  pdVar30 = (double *)operator_new__(uVar15);
  uVar88 = SUB84(pdVar30,0);
  uVar89 = (undefined4)((ulong)pdVar30 >> 0x20);
  if (-1 < (int)uVar51) {
    uVar47 = 0;
    do {
      pdVar20[uVar47] = 0.0;
      if (0 < local_218) {
        lVar12 = *(long *)((long)pvVar17 + uVar47 * 8);
        dVar56 = 0.0;
        uVar39 = 0;
        do {
          dVar57 = *(double *)(lVar12 + uVar39 * 8);
          if (dVar56 < dVar57) {
            pdVar20[uVar47] = *(double *)(plVar16[uVar47] + uVar39 * 8);
            dVar56 = dVar57;
          }
          uVar39 = uVar39 + 1;
        } while (uVar40 != uVar39);
      }
      uVar47 = uVar47 + 1;
    } while (uVar47 != uVar36);
    memset(pdVar30,0,uVar36 * 8);
    if (2 < uVar34) {
      uVar47 = 2;
      uVar39 = (ulong)DAT_0012abb0;
      do {
        dVar56 = pdVar20[uVar47];
        if ((dVar56 != 0.0) || (NAN(dVar56))) {
          dVar57 = pdVar20[uVar47 - 1];
          dVar58 = (dVar57 + dVar57) - pdVar20[uVar47 - 2];
          if (((double)((ulong)((dVar56 - dVar58) / dVar58) & uVar39) <= 0.008) ||
             (dVar58 = 0.0, (double)((ulong)(dVar56 - dVar57) & uVar39) / dVar57 <= 0.008)) {
            dVar58 = dVar56;
          }
          *(double *)(CONCAT44(uVar89,uVar88) + uVar47 * 8) = dVar58;
        }
        uVar47 = uVar47 + 1;
      } while (uVar36 != uVar47);
    }
    pdVar30 = (double *)CONCAT44(uVar89,uVar88);
    memcpy(pdVar20,pdVar30,uVar36 * 8);
  }
  uVar47 = 0xffffffffffffffff;
  if (-2 < (int)uVar7) {
    uVar47 = uVar36 * 4;
  }
  piVar31 = (int *)operator_new__(uVar47);
  uVar33 = GetBoundaryList(pdVar30,uVar34,piVar31);
  if (1 < (int)uVar33) {
    uVar39 = 0;
    do {
      iVar53 = piVar31[uVar39 * 2];
      uVar8 = piVar31[uVar39 * 2 + 1] - iVar53;
      if ((iVar53 <= piVar31[uVar39 * 2 + 1]) && ((int)uVar8 < 6)) {
        memset(pdVar20 + iVar53,0,(ulong)uVar8 * 8 + 8);
      }
      uVar39 = uVar39 + 1;
    } while (uVar33 >> 1 != uVar39);
  }
  operator_delete__(piVar31);
  uVar33 = uVar7;
  if (-1 < (int)uVar7) {
    memcpy((void *)CONCAT44(uVar89,uVar88),pdVar20,uVar36 * 8);
  }
  uVar39 = lVar37 << 2;
  if ((int)uVar7 < -1) {
    uVar39 = 0xffffffffffffffff;
  }
  piVar31 = (int *)operator_new__(uVar39);
  iVar53 = GetBoundaryList(pdVar20,uVar34,piVar31);
  iVar35 = iVar53 / 2;
  uVar39 = (long)iVar35 << 3;
  if (iVar53 < -1) {
    uVar39 = 0xffffffffffffffff;
  }
  ppdVar32 = (double **)operator_new__(uVar39);
  if (iVar53 < 2) {
    GetMultiChannelF0(pdVar20,uVar34,piVar31,iVar53,ppdVar32);
    uVar40 = uVar33;
  }
  else {
    uVar90 = 0;
    lVar12 = 0;
    do {
      pdVar30 = (double *)operator_new__(uVar15);
      ppdVar32[lVar12] = pdVar30;
      lVar12 = lVar12 + 1;
    } while (CONCAT44(uVar90,iVar35) != lVar12);
    GetMultiChannelF0(pdVar20,uVar34,piVar31,iVar53,ppdVar32);
    iVar53 = uVar33 - 1;
    lVar12 = 0;
    do {
      iVar9 = piVar31[lVar12 * 2 + 1] + 100;
      if (iVar53 < iVar9) {
        iVar9 = iVar53;
      }
      f0_candidates = (double **)ppdVar32[lVar12];
      iVar9 = ExtendF0((double *)(ulong)(uint)piVar31[lVar12 * 2 + 1],iVar9,1,(int)plVar16,uVar40,
                       f0_candidates,in_stack_fffffffffffffd38,channels_in_octave,
                       in_stack_fffffffffffffd40);
      piVar31[lVar12 * 2 + 1] = iVar9;
      uVar7 = piVar31[lVar12 * 2];
      uVar8 = 0x65;
      if (0x65 < (int)uVar7) {
        uVar8 = uVar7;
      }
      iVar9 = ExtendF0((double *)(ulong)uVar7,uVar8 - 100,-1,(int)plVar16,uVar40,f0_candidates,
                       in_stack_fffffffffffffd38,channels_in_octave,in_stack_fffffffffffffd40);
      piVar31[lVar12 * 2] = iVar9;
      lVar12 = lVar12 + 1;
    } while (CONCAT44(uVar90,iVar35) != lVar12);
    dVar56 = 0.0;
    lVar41 = 0;
    uVar40 = 0;
    lVar12 = CONCAT44(uVar90,iVar35);
    do {
      iVar53 = piVar31[lVar41 * 2];
      iVar9 = piVar31[lVar41 * 2 + 1];
      if (iVar9 - iVar53 != 0 && iVar53 <= iVar9) {
        lVar37 = (long)iVar53;
        do {
          dVar56 = dVar56 + ppdVar32[lVar41][lVar37];
          lVar37 = lVar37 + 1;
        } while (iVar9 != lVar37);
      }
      dVar57 = (double)(iVar9 - iVar53);
      dVar56 = dVar56 / dVar57;
      if (2200.0 / dVar56 < dVar57) {
        pdVar30 = ppdVar32[(int)uVar40];
        ppdVar32[(int)uVar40] = ppdVar32[lVar41];
        ppdVar32[lVar41] = pdVar30;
        uVar2 = *(undefined8 *)(piVar31 + (int)(uVar40 * 2));
        piVar31[(int)(uVar40 * 2)] = iVar53;
        piVar31[(int)(uVar40 * 2 + 1)] = iVar9;
        *(undefined8 *)(piVar31 + lVar41 * 2) = uVar2;
        uVar40 = uVar40 + 1;
      }
      lVar41 = lVar41 + 1;
    } while (lVar41 != lVar12);
    if (uVar40 != 0) {
      uVar39 = 0xffffffffffffffff;
      if (-1 < (int)uVar40) {
        uVar39 = (ulong)uVar40 * 4;
      }
      pvVar19 = operator_new__(uVar39);
      auVar78 = _DAT_0012b210;
      auVar79 = _DAT_0012aa40;
      if (0 < (int)uVar40) {
        lVar12 = (ulong)uVar40 - 1;
        auVar65._8_4_ = (int)lVar12;
        auVar65._0_8_ = lVar12;
        auVar65._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar39 = 0;
        auVar65 = auVar65 ^ _DAT_0012aa40;
        auVar70 = _DAT_0012aa30;
        do {
          bVar3 = auVar65._0_4_ < SUB164(auVar70 ^ auVar79,0);
          iVar53 = auVar65._4_4_;
          iVar9 = SUB164(auVar70 ^ auVar79,4);
          if ((bool)(~(iVar53 < iVar9 || iVar9 == iVar53 && bVar3) & 1)) {
            *(int *)((long)pvVar19 + uVar39 * 4) = (int)uVar39;
          }
          if (iVar53 >= iVar9 && (iVar9 != iVar53 || !bVar3)) {
            *(int *)((long)pvVar19 + uVar39 * 4 + 4) = (int)uVar39 + 1;
          }
          uVar39 = uVar39 + 2;
          lVar12 = auVar70._8_8_;
          auVar70._0_8_ = auVar70._0_8_ + auVar78._0_8_;
          auVar70._8_8_ = lVar12 + auVar78._8_8_;
        } while ((uVar40 + 1 & 0xfffffffe) != uVar39);
        if (uVar40 != 1) {
          uVar39 = 1;
          lVar41 = 2;
          lVar12 = lVar41;
LAB_001254ef:
          do {
            uVar14 = (ulong)((int)lVar41 - 2);
            iVar53 = *(int *)((long)pvVar19 + uVar14 * 4);
            iVar9 = *(int *)((long)pvVar19 + uVar39 * 4);
            if (piVar31[(long)iVar9 * 2] < piVar31[(long)iVar53 * 2]) {
              *(int *)((long)pvVar19 + uVar39 * 4) = iVar53;
              *(int *)((long)pvVar19 + uVar14 * 4) = iVar9;
              lVar41 = lVar41 + -1;
              if (1 < lVar41) goto LAB_001254ef;
            }
            uVar39 = uVar39 + 1;
            lVar41 = lVar12 + 1;
            lVar12 = lVar41;
          } while (uVar39 != uVar40);
        }
      }
      if (-1 < (int)uVar33) {
        pdVar30 = *ppdVar32;
        uVar39 = 0;
        do {
          *(double *)(CONCAT44(uVar89,uVar88) + uVar39 * 8) = pdVar30[uVar39];
          uVar39 = uVar39 + 1;
        } while (uVar36 != uVar39);
      }
      if (1 < (int)uVar40) {
        iVar53 = piVar31[1];
        uVar39 = 1;
        lVar12 = CONCAT44(uVar89,uVar88);
        do {
          iVar9 = *(int *)((long)pvVar19 + uVar39 * 4);
          lVar41 = (long)iVar9;
          uVar7 = iVar9 * 2;
          iVar9 = piVar31[lVar41 * 2];
          lVar37 = (long)iVar9;
          if (iVar53 < iVar9) {
            iVar81 = piVar31[(int)(uVar7 | 1)];
            if (iVar9 <= iVar81) {
              pdVar30 = ppdVar32[lVar41];
              lVar41 = 0;
              do {
                *(double *)(CONCAT44(uVar89,uVar88) + lVar37 * 8 + lVar41 * 8) =
                     pdVar30[lVar37 + lVar41];
                lVar41 = lVar41 + 1;
              } while ((iVar81 - iVar9) + 1 != (int)lVar41);
            }
            *piVar31 = iVar9;
          }
          else {
            pdVar30 = ppdVar32[lVar41];
            iVar50 = piVar31[(int)(uVar7 | 1)];
            if ((iVar9 < *piVar31) || (iVar81 = iVar53, iVar53 < iVar50)) {
              dVar56 = 0.0;
              dVar57 = 0.0;
              lVar41 = lVar37;
              do {
                auVar74 = ZEXT816(0);
                dVar58 = 0.0;
                dVar59 = 0.0;
                if (0 < local_218) {
                  dVar59 = *(double *)(lVar12 + lVar41 * 8);
                  lVar43 = *(long *)((long)pvVar17 + lVar41 * 8);
                  uVar14 = 0;
                  do {
                    dVar58 = *(double *)(plVar16[lVar41] + uVar14 * 8);
                    if (((dVar58 == dVar59) && (!NAN(dVar58) && !NAN(dVar59))) &&
                       (dVar58 = *(double *)(lVar43 + uVar14 * 8), auVar74._0_8_ < dVar58)) {
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = dVar58;
                    }
                    dVar58 = auVar74._0_8_;
                    uVar14 = uVar14 + 1;
                  } while (local_1d8 != uVar14);
                  auVar80 = ZEXT816(0);
                  uVar14 = 0;
                  do {
                    dVar59 = *(double *)(plVar16[lVar41] + uVar14 * 8);
                    if (((dVar59 == pdVar30[lVar41]) && (!NAN(dVar59) && !NAN(pdVar30[lVar41]))) &&
                       (dVar59 = *(double *)(lVar43 + uVar14 * 8), auVar80._0_8_ < dVar59)) {
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ = dVar59;
                    }
                    dVar59 = auVar80._0_8_;
                    uVar14 = uVar14 + 1;
                  } while (local_1d8 != uVar14);
                }
                dVar56 = dVar56 + dVar59;
                dVar57 = dVar57 + dVar58;
                lVar41 = lVar41 + 1;
              } while (iVar53 + 1 != (int)lVar41);
              iVar81 = iVar50;
              if (dVar57 <= dVar56) {
                if (iVar9 <= iVar50) {
                  lVar41 = 0;
                  do {
                    *(double *)(lVar12 + lVar37 * 8 + lVar41 * 8) = pdVar30[lVar37 + lVar41];
                    lVar41 = lVar41 + 1;
                  } while ((iVar50 - iVar9) + 1 != (int)lVar41);
                }
              }
              else if (iVar53 <= iVar50) {
                lVar41 = 0;
                do {
                  *(double *)(lVar12 + (long)iVar53 * 8 + lVar41 * 8) = pdVar30[iVar53 + lVar41];
                  lVar41 = lVar41 + 1;
                } while ((iVar50 - iVar53) + 1 != (int)lVar41);
              }
            }
          }
          iVar53 = iVar81;
          piVar31[1] = iVar53;
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar40);
      }
      operator_delete__(pvVar19);
      lVar12 = CONCAT44(uVar90,iVar35);
    }
    lVar41 = 0;
    uVar40 = uVar33;
    do {
      if (ppdVar32[lVar41] != (double *)0x0) {
        operator_delete__(ppdVar32[lVar41]);
      }
      lVar41 = lVar41 + 1;
    } while (lVar12 != lVar41);
  }
  operator_delete__(ppdVar32);
  operator_delete__(piVar31);
  pdVar30 = (double *)CONCAT44(uVar89,uVar88);
  if (-1 < (int)uVar33) {
    memcpy(pvVar18,pdVar30,uVar36 << 3);
  }
  piVar31 = (int *)operator_new__(uVar47);
  uVar7 = GetBoundaryList(pdVar30,uVar34,piVar31);
  auVar78 = _DAT_0012aa40;
  auVar79 = _DAT_0012aa30;
  if (3 < (int)uVar7) {
    uVar47 = 0;
    do {
      iVar53 = piVar31[uVar47 * 2 + 2];
      uVar8 = piVar31[uVar47 * 2 + 1];
      lVar12 = (long)(int)uVar8;
      if (((int)(~uVar8 + iVar53) < 9) && ((int)uVar8 < iVar53 + -1)) {
        dVar57 = *(double *)(CONCAT44(uVar89,uVar88) + lVar12 * 8) + 1.0;
        dVar56 = ((*(double *)(CONCAT44(uVar89,uVar88) + (long)iVar53 * 8) + -1.0) - dVar57) /
                 ((double)(int)(~uVar8 + iVar53) + 1.0);
        lVar41 = (iVar53 + -1) - lVar12;
        lVar37 = lVar41 + -1;
        auVar85._8_4_ = (int)lVar37;
        auVar85._0_8_ = lVar37;
        auVar85._12_4_ = (int)((ulong)lVar37 >> 0x20);
        auVar85 = auVar85 ^ auVar78;
        uVar39 = 0;
        do {
          iVar53 = (int)uVar39;
          auVar87._8_4_ = iVar53;
          auVar87._0_8_ = uVar39;
          auVar87._12_4_ = (int)(uVar39 >> 0x20);
          auVar73 = (auVar87 | auVar79) ^ auVar78;
          if ((bool)(~(auVar73._4_4_ == auVar85._4_4_ && auVar85._0_4_ < auVar73._0_4_ ||
                      auVar85._4_4_ < auVar73._4_4_) & 1)) {
            *(double *)((long)pvVar18 + uVar39 * 8 + lVar12 * 8 + 8) =
                 (double)(iVar53 + 1) * dVar56 + dVar57;
          }
          if ((auVar73._12_4_ != auVar85._12_4_ || auVar73._8_4_ <= auVar85._8_4_) &&
              auVar73._12_4_ <= auVar85._12_4_) {
            *(double *)((long)pvVar18 + uVar39 * 8 + lVar12 * 8 + 0x10) =
                 (double)(iVar53 + 2) * dVar56 + dVar57;
          }
          uVar39 = uVar39 + 2;
        } while ((lVar41 + 1U & 0xfffffffffffffffe) != uVar39);
      }
      uVar47 = uVar47 + 1;
    } while (uVar47 != (uVar7 >> 1) - 1);
  }
  operator_delete__(piVar31);
  operator_delete__(pdVar20);
  operator_delete__((void *)CONCAT44(uVar89,uVar88));
  uVar7 = uVar33 + 0x259;
  uVar47 = (long)(int)uVar7 * 8;
  if ((int)uVar33 < -0x259) {
    uVar47 = 0xffffffffffffffff;
  }
  uVar8 = uVar7;
  pdVar30 = (double *)operator_new__(uVar47);
  memset(pdVar30,0,0x960);
  iVar53 = uVar33 + 0x12d;
  if (-1 < (int)uVar33) {
    iVar35 = 0x12d;
    if (0x12d < iVar53) {
      iVar35 = iVar53;
    }
    memcpy(pdVar30 + 300,pvVar18,(ulong)(iVar35 - 300) << 3);
  }
  uVar34 = uVar33 + 0x12e;
  if ((int)(uVar33 + 0x12e) < (int)uVar8) {
    uVar34 = uVar8;
  }
  memset(pdVar30 + iVar53,0,(ulong)((uVar34 - uVar33) - 0x12e) * 8 + 8);
  uVar39 = (long)(int)uVar7 << 2;
  if ((int)uVar33 < -0x259) {
    uVar39 = 0xffffffffffffffff;
  }
  piVar31 = (int *)operator_new__(uVar39);
  iVar53 = GetBoundaryList(pdVar30,uVar7,piVar31);
  uVar39 = (long)(iVar53 / 2) << 3;
  if (iVar53 < -1) {
    uVar39 = 0xffffffffffffffff;
  }
  ppdVar32 = (double **)operator_new__(uVar39);
  if (iVar53 < 2) {
    GetMultiChannelF0(pdVar30,uVar8,piVar31,iVar53,ppdVar32);
  }
  else {
    uVar88 = SUB84(piVar31,0);
    uVar89 = (undefined4)((ulong)piVar31 >> 0x20);
    uVar39 = (ulong)(uint)(iVar53 / 2);
    uVar14 = 0;
    do {
      pdVar20 = (double *)operator_new__(uVar47);
      ppdVar32[uVar14] = pdVar20;
      uVar14 = uVar14 + 1;
    } while (uVar39 != uVar14);
    uVar7 = uVar8;
    GetMultiChannelF0(pdVar30,uVar8,(int *)CONCAT44(uVar89,uVar88),iVar53,ppdVar32);
    uVar47 = 0xffffffffffffffff;
    if (-0x25a < (int)uVar40) {
      uVar47 = (ulong)uVar8 * 8;
    }
    iVar53 = uVar40 + 599;
    uVar14 = 0;
    do {
      pdVar20 = ppdVar32[uVar14];
      iVar35 = *(int *)(CONCAT44(uVar89,uVar88) + uVar14 * 8);
      lVar12 = (long)iVar35;
      iVar9 = *(int *)(CONCAT44(uVar89,uVar88) + 4 + uVar14 * 8);
      pdVar21 = (double *)operator_new__(uVar47);
      auVar78 = _DAT_0012aa40;
      auVar79 = _DAT_0012aa30;
      if (0 < lVar12) {
        dVar56 = pdVar20[lVar12];
        lVar41 = lVar12 + -1;
        auVar71._8_4_ = (int)lVar41;
        auVar71._0_8_ = lVar41;
        auVar71._12_4_ = (int)((ulong)lVar41 >> 0x20);
        auVar71 = auVar71 ^ _DAT_0012aa40;
        lVar41 = 0;
        auVar75 = _DAT_0012aa30;
        do {
          bVar3 = auVar71._0_4_ < SUB164(auVar75 ^ auVar78,0);
          iVar50 = auVar71._4_4_;
          iVar81 = SUB164(auVar75 ^ auVar78,4);
          if ((bool)(~(iVar50 < iVar81 || iVar81 == iVar50 && bVar3) & 1)) {
            *(double *)((long)pdVar20 + lVar41) = dVar56;
          }
          if (iVar50 >= iVar81 && (iVar81 != iVar50 || !bVar3)) {
            *(double *)((long)pdVar20 + lVar41 + 8) = dVar56;
          }
          lVar37 = auVar75._8_8_;
          auVar75._0_8_ = auVar75._0_8_ + 2;
          auVar75._8_8_ = lVar37 + 2;
          lVar41 = lVar41 + 0x10;
        } while ((ulong)(iVar35 + 1U >> 1) << 4 != lVar41);
      }
      lVar41 = (long)iVar9 + 1;
      if ((int)lVar41 < (int)uVar7) {
        dVar56 = pdVar20[iVar9];
        uVar33 = iVar53 - iVar9;
        auVar72._4_4_ = 0;
        auVar72._0_4_ = uVar33;
        auVar72._8_4_ = uVar33;
        auVar72._12_4_ = 0;
        uVar49 = 0;
        do {
          auVar76._8_4_ = (int)uVar49;
          auVar76._0_8_ = uVar49;
          auVar76._12_4_ = (int)(uVar49 >> 0x20);
          auVar73 = (auVar76 | auVar79) ^ auVar78;
          bVar3 = SUB164(auVar72 ^ auVar78,0) < auVar73._0_4_;
          iVar50 = SUB164(auVar72 ^ auVar78,4);
          iVar81 = auVar73._4_4_;
          if ((iVar50 < iVar81 || iVar81 == iVar50 && bVar3) != true) {
            pdVar20[lVar41 + uVar49] = dVar56;
          }
          if (iVar50 >= iVar81 && (iVar81 != iVar50 || !bVar3)) {
            pdVar20[lVar41 + uVar49 + 1] = dVar56;
          }
          uVar49 = uVar49 + 2;
        } while (((ulong)uVar33 + 2 & 0xfffffffffffffffe) != uVar49);
      }
      if (-0x259 < (int)uVar40) {
        uVar49 = (ulong)uVar8;
        dVar56 = 0.0;
        dVar57 = 0.0;
        do {
          dVar58 = dVar56;
          dVar56 = dVar57 * -0.7660066009432641 + dVar58 * 1.7347257688092754 + *pdVar20;
          pdVar21[uVar49 - 1] =
               dVar57 * 0.007820208033497172 +
               dVar56 * 0.007820208033497172 + dVar58 * 0.015640416066994345;
          pdVar20 = pdVar20 + 1;
          uVar49 = uVar49 - 1;
          dVar57 = dVar58;
        } while (uVar49 != 0);
        uVar49 = (ulong)uVar8;
        pdVar20 = pdVar21;
        dVar56 = 0.0;
        dVar57 = 0.0;
        do {
          dVar58 = dVar56;
          dVar56 = dVar57 * -0.7660066009432641 + dVar58 * 1.7347257688092754 + *pdVar20;
          pdVar30[uVar49 - 1] =
               dVar57 * 0.007820208033497172 +
               dVar56 * 0.007820208033497172 + dVar58 * 0.015640416066994345;
          pdVar20 = pdVar20 + 1;
          uVar49 = uVar49 - 1;
          dVar57 = dVar58;
        } while (uVar49 != 0);
      }
      operator_delete__(pdVar21);
      if (iVar35 <= iVar9) {
        memcpy(temporal_positions + lVar12 + -300,pdVar30 + lVar12,
               (ulong)(uint)(iVar9 - iVar35) * 8 + 8);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar39);
    uVar47 = 0;
    piVar31 = (int *)CONCAT44(uVar89,uVar88);
    do {
      if (ppdVar32[uVar47] != (double *)0x0) {
        operator_delete__(ppdVar32[uVar47]);
      }
      uVar47 = uVar47 + 1;
    } while (uVar39 != uVar47);
  }
  operator_delete__(ppdVar32);
  operator_delete__(pdVar30);
  operator_delete__(piVar31);
  operator_delete__(in);
  operator_delete__(pvVar18);
  operator_delete__(out);
  if (-1 < (int)uVar40) {
    uVar47 = 0;
    do {
      if ((void *)plVar16[uVar47] != (void *)0x0) {
        operator_delete__((void *)plVar16[uVar47]);
      }
      pvVar18 = *(void **)((long)pvVar17 + uVar47 * 8);
      if (pvVar18 != (void *)0x0) {
        operator_delete__(pvVar18);
      }
      uVar47 = uVar47 + 1;
    } while (uVar36 != uVar47);
  }
  operator_delete__(plVar16);
  operator_delete__(pvVar17);
  operator_delete__(pdVar13);
  return;
}

Assistant:

static void HarvestGeneralBody(const double *x, int x_length, int fs,
    int frame_period, double f0_floor, double f0_ceil,
#if 0
    double channels_in_octave, int speed, double *temporal_positions,
    double *f0) {
#else
    double channels_in_octave, int speed, double allowed_range,
    double *temporal_positions, double *f0) {
#endif
  double adjusted_f0_floor = f0_floor * 0.9;
  double adjusted_f0_ceil = f0_ceil * 1.1;
  int number_of_channels =
    1 + static_cast<int>(log(adjusted_f0_ceil / adjusted_f0_floor) /
    world::kLog2 * channels_in_octave);
  double *boundary_f0_list = new double[number_of_channels];
  for (int i = 0; i < number_of_channels; ++i)
    boundary_f0_list[i] =
    adjusted_f0_floor * pow(2.0, (i + 1) / channels_in_octave);

  // normalization
  int decimation_ratio = MyMaxInt(MyMinInt(speed, 12), 1);
  int y_length =
    static_cast<int>(ceil(static_cast<double>(x_length) / decimation_ratio));
  double actual_fs = static_cast<double>(fs) / decimation_ratio;
  int fft_size = GetSuitableFFTSize(y_length + 5 +
    2 * static_cast<int>(2.0 * actual_fs / boundary_f0_list[0]));

  // Calculation of the spectrum used for the f0 estimation
  double *y = new double[fft_size];
  fft_complex *y_spectrum = new fft_complex[fft_size];
  GetWaveformAndSpectrum(x, x_length, y_length, actual_fs, fft_size,
      decimation_ratio, y, y_spectrum);

  int f0_length = GetSamplesForHarvest(fs, x_length, frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * frame_period / 1000.0;
    f0[i] = 0.0;
  }

  int overlap_parameter = 7;
  int max_candidates =
    matlab_round(number_of_channels / 10.0) * overlap_parameter;
  double **f0_candidates = new double *[f0_length];
  double **f0_candidates_score = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    f0_candidates[i] = new double[max_candidates];
    f0_candidates_score[i] = new double[max_candidates];
  }

  int number_of_candidates = HarvestGeneralBodySub(boundary_f0_list,
    number_of_channels, f0_length, actual_fs, y_length, temporal_positions,
    y_spectrum, fft_size, f0_floor, f0_ceil, max_candidates, f0_candidates) *
    overlap_parameter;

  RefineF0Candidates(y, y_length, actual_fs, temporal_positions, f0_length,
      number_of_candidates, f0_floor, f0_ceil, f0_candidates,
      f0_candidates_score);
  RemoveUnreliableCandidates(f0_length, number_of_candidates,
      f0_candidates, f0_candidates_score);

  double *best_f0_contour = new double[f0_length];
  FixF0Contour(f0_candidates, f0_candidates_score, f0_length,
#if 0
      number_of_candidates, best_f0_contour);
#else
      number_of_candidates, allowed_range, best_f0_contour);
#endif
  SmoothF0Contour(best_f0_contour, f0_length, f0);

  delete[] y;
  delete[] best_f0_contour;
  delete[] y_spectrum;
  for (int i = 0; i < f0_length; ++i) {
    delete[] f0_candidates[i];
    delete[] f0_candidates_score[i];
  }
  delete[] f0_candidates;
  delete[] f0_candidates_score;
  delete[] boundary_f0_list;
}